

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void int_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                 JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JSAMPLE JVar2;
  JSAMPARRAY input_array;
  uint uVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  int local_68;
  int local_64;
  int outrow;
  int inrow;
  int v_expand;
  int h_expand;
  JSAMPROW outend;
  int h;
  JSAMPLE invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  my_upsample_ptr_conflict upsample;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  input_array = *output_data_ptr;
  bVar1 = *(byte *)((long)&cinfo->upsample[9].need_context_rows + (long)compptr->component_index);
  uVar3 = (uint)*(byte *)((long)&cinfo->upsample[10].start_pass + (long)compptr->component_index + 2
                         );
  local_64 = 0;
  for (local_68 = 0; local_68 < cinfo->max_v_samp_factor; local_68 = uVar3 + local_68) {
    _h = input_array[local_68];
    pJVar4 = _h + cinfo->output_width;
    outptr = input_data[local_64];
    while (_h < pJVar4) {
      pJVar5 = outptr + 1;
      JVar2 = *outptr;
      for (outend._0_4_ = (uint)bVar1; outptr = pJVar5, 0 < (int)(uint)outend;
          outend._0_4_ = (uint)outend - 1) {
        *_h = JVar2;
        _h = _h + 1;
      }
    }
    if (1 < uVar3) {
      jcopy_sample_rows(input_array,local_68,input_array,local_68 + 1,uVar3 - 1,cinfo->output_width)
      ;
    }
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_upsample (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	      JSAMPARRAY input_data, JSAMPARRAY * output_data_ptr)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  register int h;
  JSAMPROW outend;
  int h_expand, v_expand;
  int inrow, outrow;

  h_expand = upsample->h_expand[compptr->component_index];
  v_expand = upsample->v_expand[compptr->component_index];

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    /* Generate one output row with proper horizontal expansion */
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;	/* don't need GETJSAMPLE() here */
      for (h = h_expand; h > 0; h--) {
	*outptr++ = invalue;
      }
    }
    /* Generate any additional output rows by duplicating the first one */
    if (v_expand > 1) {
      jcopy_sample_rows(output_data, outrow, output_data, outrow+1,
			v_expand-1, cinfo->output_width);
    }
    inrow++;
    outrow += v_expand;
  }
}